

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O3

wchar_t property_cost(obj_property *prop,wchar_t value,_Bool price)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t *pwVar3;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,price) == 0) {
    pwVar3 = &prop->design_constant;
    iVar2 = prop->design_square * value + prop->design_linear;
  }
  else {
    pwVar3 = &prop->price_constant;
    wVar1 = -value;
    if (L'\0' < value) {
      wVar1 = value;
    }
    iVar2 = wVar1 * prop->price_square + prop->price_linear;
  }
  return iVar2 * value + *pwVar3;
}

Assistant:

int property_cost(struct obj_property *prop, int value, bool price)
{
	if (price) {
		return prop->price_constant + prop->price_linear * value +
			prop->price_square * value * ((value > 0) ? value : (0 - value));
	}

	return prop->design_constant + prop->design_linear * value +
		prop->design_square * value * value;
}